

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyDrawIndexedIndirectAttribs(DrawIndexedIndirectAttribs *Attribs)

{
  IBuffer *pIVar1;
  IBuffer *pIVar2;
  int iVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined4 extraout_var;
  ulong uVar4;
  char (*Args_1) [26];
  uint uVar5;
  char (*in_RCX) [46];
  char (*Args_1_00) [37];
  char (*in_R9) [53];
  char (*pacVar6) [7];
  string msg;
  Uint64 ReqAttrBufSize;
  Uint64 ReqCountBufSize;
  char (*Args_3) [53];
  undefined4 extraout_var_00;
  
  pIVar1 = Attribs->pAttribsBuffer;
  pIVar2 = Attribs->pCounterBuffer;
  if (pIVar1 == (IBuffer *)0x0) {
    FormatString<char[44],char[46]>
              (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])"indirect draw arguments buffer must not null.",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x9b);
    in_RAX = &msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != in_RAX) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      in_RAX = extraout_RAX;
    }
  }
  uVar5 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),Attribs->IndexType) - 5;
  Args_1_00 = (char (*) [37])(ulong)uVar5;
  if (1 < (byte)uVar5) {
    ReqAttrBufSize = (Uint64)GetValueTypeString(Attribs->IndexType);
    FormatString<char[44],char[12],char_const*,char[34]>
              (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])0x357add,(char (*) [12])&ReqAttrBufSize,
               (char **)") must be VT_UINT16 or VT_UINT32.",(char (*) [34])in_R9);
    Args_1_00 = (char (*) [37])0x9d;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x9d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pacVar6 = (char (*) [7])0x260e44;
  iVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
  Args_3 = (char (*) [53])CONCAT44(extraout_var,iVar3);
  if (((*Args_3)[0x11] & 1U) == 0) {
    FormatString<char[44],char[33],char_const*,char[53]>
              (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])0x356805,(char (*) [33])Args_3,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    Args_1_00 = (char (*) [37])0xa0;
    pacVar6 = (char (*) [7])0x260e8e;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      pacVar6 = (char (*) [7])0x260ea9;
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (1 < Attribs->DrawCount) {
    if (Attribs->DrawArgsStride < 0x14) {
      FormatString<char[44],char[37]>
                (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"stride must be greater than 20 bytes",Args_1_00);
      Args_1_00 = (char (*) [37])0xa4;
      pacVar6 = (char (*) [7])0x260ef0;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xa4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pacVar6 = (char (*) [7])0x260f0b;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((Attribs->DrawArgsStride & 3) != 0) {
      FormatString<char[44],char[31]>
                (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"stride must be a multiple of 4",(char (*) [31])Args_1_00);
      pacVar6 = (char (*) [7])0x260f48;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xa5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pacVar6 = (char (*) [7])0x260f63;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  uVar4 = 0x14;
  if (1 < Attribs->DrawCount) {
    uVar4 = (ulong)(Attribs->DrawArgsStride * Attribs->DrawCount);
  }
  ReqAttrBufSize = uVar4 + Attribs->DrawArgsOffset;
  if (*(ulong *)(*Args_3 + 8) < ReqAttrBufSize) {
    FormatString<char[44],char[25],unsigned_long,char[38],char_const*,char[25],unsigned_long,char[7]>
              (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
               (char (*) [44])"invalid DrawArgsOffset (",(char (*) [25])&Attribs->DrawArgsOffset,
               (unsigned_long *)") or indirect draw arguments buffer \'",(char (*) [38])Args_3,
               (char **)"\' size must be at least ",(char (*) [25])&ReqAttrBufSize,
               (unsigned_long *)0x356920,pacVar6);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0xaa);
    in_R9 = Args_3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      in_R9 = Args_3;
    }
  }
  if (pIVar2 != (IBuffer *)0x0) {
    pacVar6 = (char (*) [7])0x26101c;
    iVar3 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
    Args_1 = (char (*) [26])CONCAT44(extraout_var_00,iVar3);
    if (((*Args_1)[0x11] & 1U) == 0) {
      FormatString<char[44],char[26],char_const*,char[53]>
                (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"indirect counter buffer \'",Args_1,
                 (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
      pacVar6 = (char (*) [7])0x261065;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xb0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        pacVar6 = (char (*) [7])0x261080;
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    ReqCountBufSize = Attribs->CounterOffset + 4;
    if (*(ulong *)(*Args_1 + 8) < ReqCountBufSize) {
      FormatString<char[44],char[24],unsigned_long,char[22],char_const*,char[25],unsigned_long,char[7]>
                (&msg,(Diligent *)"Draw indexed indirect attribs are invalid: ",
                 (char (*) [44])"invalid CounterOffset (",(char (*) [24])&Attribs->CounterOffset,
                 (unsigned_long *)") or counter buffer \'",(char (*) [22])Args_1,
                 (char **)"\' size must be at least ",(char (*) [25])&ReqCountBufSize,
                 (unsigned_long *)0x356920,pacVar6);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDrawIndexedIndirectAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0xb3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return true;
}

Assistant:

bool VerifyDrawIndexedIndirectAttribs(const DrawIndexedIndirectAttribs& Attribs)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;
    const IBuffer* pCounterBuffer = Attribs.pCounterBuffer;

#define CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indexed indirect attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect draw arguments buffer must not null.");
    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Attribs.IndexType == VT_UINT16 || Attribs.IndexType == VT_UINT32,
                                        "IndexType (", GetValueTypeString(Attribs.IndexType), ") must be VT_UINT16 or VT_UINT32.");
    const BufferDesc& AttrBuffDesc = pAttribsBuffer->GetDesc();
    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS((AttrBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                        "indirect draw arguments buffer '", AttrBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");

    if (Attribs.DrawCount > 1)
    {
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Attribs.DrawArgsStride >= sizeof(Uint32) * 5, "stride must be greater than 20 bytes");
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(Attribs.DrawArgsStride % 4 == 0, "stride must be a multiple of 4");
    }

    const Uint64 ReqAttrBufSize = Attribs.DrawArgsOffset + (Attribs.DrawCount > 1 ? Attribs.DrawCount * Attribs.DrawArgsStride : Uint32{sizeof(Uint32)} * 5);
    CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(ReqAttrBufSize <= AttrBuffDesc.Size, "invalid DrawArgsOffset (", Attribs.DrawArgsOffset,
                                        ") or indirect draw arguments buffer '", AttrBuffDesc.Name, "' size must be at least ", ReqAttrBufSize, " bytes");

    if (pCounterBuffer != nullptr)
    {
        const BufferDesc& CntBuffDesc = pCounterBuffer->GetDesc();
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS((CntBuffDesc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0, "indirect counter buffer '",
                                            CntBuffDesc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
        const Uint64 ReqCountBufSize = Attribs.CounterOffset + sizeof(Uint32);
        CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS(ReqCountBufSize <= CntBuffDesc.Size, "invalid CounterOffset (", Attribs.CounterOffset,
                                            ") or counter buffer '", CntBuffDesc.Name, "' size must be at least ", ReqCountBufSize, " bytes");
    }

#undef CHECK_DRAW_INDEXED_INDIRECT_ATTRIBS

    return true;
}